

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLin>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  GetterHeatmap<short> *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  ImVec2 IVar11;
  ImDrawIdx IVar12;
  ImU32 IVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  double dVar22;
  ImVec2 IVar23;
  double dVar24;
  
  pGVar8 = this->Getter;
  iVar5 = pGVar8->Cols;
  dVar2 = (pGVar8->HalfSize).x;
  dVar3 = pGVar8->XRef;
  dVar22 = pGVar8->Width;
  dVar24 = (pGVar8->HalfSize).y;
  dVar20 = ((double)(prim / iVar5) * pGVar8->Height + dVar24) * pGVar8->YDir + pGVar8->YRef;
  fVar15 = (float)(((double)(int)pGVar8->Values[prim] - pGVar8->ScaleMin) /
                  (pGVar8->ScaleMax - pGVar8->ScaleMin));
  fVar16 = 1.0;
  if (fVar15 <= 1.0) {
    fVar16 = fVar15;
  }
  IVar13 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar16));
  if (IVar13 < 0x1000000) {
    bVar14 = false;
  }
  else {
    iVar6 = this->Transformer->YAxis;
    dVar18 = (double)GImPlot->PixelRange[iVar6].Min.y;
    dVar4 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
    fVar15 = (float)(((dVar20 - dVar24) - dVar4) * GImPlot->My[iVar6] + dVar18);
    fVar17 = (float)(((dVar24 + dVar20) - dVar4) * GImPlot->My[iVar6] + dVar18);
    fVar16 = fVar15;
    if (fVar17 <= fVar15) {
      fVar16 = fVar17;
    }
    bVar14 = false;
    if ((fVar16 < (cull_rect->Max).y) &&
       (fVar16 = (float)(~-(uint)(fVar17 <= fVar15) & (uint)fVar17 |
                        -(uint)(fVar17 <= fVar15) & (uint)fVar15), pfVar1 = &(cull_rect->Min).y,
       *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
      dVar24 = (double)(prim % iVar5) * dVar22 + dVar3 + dVar2;
      dVar22 = (double)GImPlot->PixelRange[iVar6].Min.x;
      dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
      fVar21 = (float)(((dVar24 - dVar2) - dVar3) * GImPlot->Mx + dVar22);
      fVar19 = (float)(((dVar24 + dVar2) - dVar3) * GImPlot->Mx + dVar22);
      fVar16 = fVar21;
      if (fVar19 <= fVar21) {
        fVar16 = fVar19;
      }
      if ((fVar16 < (cull_rect->Max).x) &&
         (fVar16 = (float)(~-(uint)(fVar19 <= fVar21) & (uint)fVar19 |
                          -(uint)(fVar19 <= fVar21) & (uint)fVar21),
         (cull_rect->Min).x <= fVar16 && fVar16 != (cull_rect->Min).x)) {
        IVar23.y = fVar15;
        IVar23.x = fVar21;
        DrawList->_VtxWritePtr->pos = IVar23;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar9 = DrawList->_VtxWritePtr;
        pIVar9->col = IVar13;
        pIVar9[1].pos.x = fVar21;
        pIVar9[1].pos.y = fVar17;
        pIVar9[1].uv = *uv;
        pIVar9 = DrawList->_VtxWritePtr;
        pIVar9[1].col = IVar13;
        IVar11.y = fVar17;
        IVar11.x = fVar19;
        pIVar9[2].pos = IVar11;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar9 = DrawList->_VtxWritePtr;
        pIVar9[2].col = IVar13;
        pIVar9[3].pos.x = fVar19;
        pIVar9[3].pos.y = fVar15;
        pIVar9[3].uv = *uv;
        pIVar9 = DrawList->_VtxWritePtr;
        pIVar9[3].col = IVar13;
        DrawList->_VtxWritePtr = pIVar9 + 4;
        uVar7 = DrawList->_VtxCurrentIdx;
        pIVar10 = DrawList->_IdxWritePtr;
        IVar12 = (ImDrawIdx)uVar7;
        *pIVar10 = IVar12;
        pIVar10[1] = IVar12 + 1;
        pIVar10[2] = IVar12 + 3;
        pIVar10[3] = IVar12 + 1;
        pIVar10[4] = IVar12 + 2;
        pIVar10[5] = IVar12 + 3;
        DrawList->_IdxWritePtr = pIVar10 + 6;
        DrawList->_VtxCurrentIdx = uVar7 + 4;
        bVar14 = true;
      }
    }
  }
  return bVar14;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }